

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseline.cc
# Opt level: O0

base_learner * baseline_setup(options_i *options,vw *all)

{
  undefined1 uVar1;
  typed_option<bool> *op;
  example *peVar2;
  pointer pbVar3;
  single_learner *base_00;
  vw *pvVar4;
  vw *in_RSI;
  undefined8 *in_RDI;
  learner<baseline,_example> *l;
  single_learner *base;
  string loss_function_type;
  option_group_definition new_options;
  string loss_function;
  bool baseline_option;
  free_ptr<baseline> data;
  string *in_stack_fffffffffffffa78;
  vw *in_stack_fffffffffffffa80;
  string *in_stack_fffffffffffffa88;
  base_learner *in_stack_fffffffffffffa90;
  undefined7 in_stack_fffffffffffffa98;
  learner<baseline,_example> *this;
  typed_option<float> *in_stack_fffffffffffffac8;
  option_group_definition *in_stack_fffffffffffffad0;
  option_group_definition *this_00;
  string local_4a0 [32];
  undefined4 local_480;
  allocator local_479;
  string local_478 [39];
  undefined1 local_451 [145];
  learner<char,_char> *in_stack_fffffffffffffc40;
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [32];
  typed_option<bool> local_340;
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [199];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [32];
  typed_option<bool> local_160;
  allocator local_a9;
  string local_a8 [32];
  undefined1 local_88 [56];
  string local_50 [39];
  byte local_29;
  learner<baseline,_example> local_28 [16];
  vw *local_18;
  undefined8 *local_10;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<baseline>();
  local_29 = 0;
  std::__cxx11::string::string(local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"Baseline options",&local_a9);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"baseline",&local_181);
  VW::config::make_option<bool>(in_stack_fffffffffffffa88,(bool *)in_stack_fffffffffffffa80);
  VW::config::typed_option<bool>::keep(&local_160,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1a8,
             "Learn an additive baseline (from constant features) and a residual separately in regression."
             ,&local_1a9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffffad0,(typed_option<bool> *)in_stack_fffffffffffffac8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"lr_multiplier",&local_271);
  std::unique_ptr<baseline,_void_(*)(void_*)>::operator->
            ((unique_ptr<baseline,_void_(*)(void_*)> *)0x32948c);
  VW::config::make_option<float>(in_stack_fffffffffffffa88,(float *)in_stack_fffffffffffffa80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"learning rate multiplier for baseline model",&local_299);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"global_only",&local_361);
  std::unique_ptr<baseline,_void_(*)(void_*)>::operator->
            ((unique_ptr<baseline,_void_(*)(void_*)> *)0x32955b);
  VW::config::make_option<bool>(in_stack_fffffffffffffa88,(bool *)in_stack_fffffffffffffa80);
  VW::config::typed_option<bool>::keep(&local_340,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_388,"use separate example with only global constant for baseline predictions",
             &local_389);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffffad0,(typed_option<bool> *)in_stack_fffffffffffffac8);
  this_00 = (option_group_definition *)local_451;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_451 + 1),"check_enabled",(allocator *)this_00);
  std::unique_ptr<baseline,_void_(*)(void_*)>::operator->
            ((unique_ptr<baseline,_void_(*)(void_*)> *)0x32962b);
  VW::config::make_option<bool>(in_stack_fffffffffffffa88,(bool *)in_stack_fffffffffffffa80);
  op = VW::config::typed_option<bool>::keep((typed_option<bool> *)(local_451 + 0x21),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_478,"only use baseline when the example contains enabled flag",&local_479);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>(this_00,op);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffffa80);
  std::__cxx11::string::~string((string *)(local_451 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_451);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffffa80);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffffa80);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffffa80);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  (**(code **)*local_10)(local_10,local_88);
  if ((local_29 & 1) == 0) {
    local_8 = (base_learner *)0x0;
    local_480 = 1;
  }
  else {
    peVar2 = VW::alloc_examples((size_t)in_stack_fffffffffffffa88,(size_t)in_stack_fffffffffffffa80)
    ;
    this = local_28;
    pbVar3 = std::unique_ptr<baseline,_void_(*)(void_*)>::operator->
                       ((unique_ptr<baseline,_void_(*)(void_*)> *)0x329b67);
    pbVar3->ec = peVar2;
    pbVar3 = std::unique_ptr<baseline,_void_(*)(void_*)>::operator->
                       ((unique_ptr<baseline,_void_(*)(void_*)> *)0x329b79);
    pvVar4 = local_18;
    pbVar3->ec->in_use = true;
    pbVar3 = std::unique_ptr<baseline,_void_(*)(void_*)>::operator->
                       ((unique_ptr<baseline,_void_(*)(void_*)> *)0x329b9a);
    pbVar3->all = pvVar4;
    (**local_18->loss->_vptr_loss_function)(local_4a0);
    uVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffa80,(char *)in_stack_fffffffffffffa78);
    if ((bool)uVar1) {
      pbVar3 = std::unique_ptr<baseline,_void_(*)(void_*)>::operator->
                         ((unique_ptr<baseline,_void_(*)(void_*)> *)0x329bf5);
      pbVar3->lr_scaling = true;
    }
    in_stack_fffffffffffffa90 =
         setup_base((options_i *)in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    base_00 = LEARNER::as_singleline<char,char>(in_stack_fffffffffffffc40);
    pvVar4 = (vw *)LEARNER::init_learner<baseline,example,LEARNER::learner<char,example>>
                             ((free_ptr<baseline> *)in_stack_fffffffffffffa90,base_00,
                              (_func_void_baseline_ptr_learner<char,_example>_ptr_example_ptr *)
                              in_stack_fffffffffffffa80,
                              (_func_void_baseline_ptr_learner<char,_example>_ptr_example_ptr *)
                              in_stack_fffffffffffffa78);
    in_stack_fffffffffffffa80 = pvVar4;
    LEARNER::learner<baseline,_example>::set_sensitivity
              ((learner<baseline,_example> *)pvVar4,sensitivity);
    LEARNER::learner<baseline,_example>::set_finish
              (this,(_func_void_baseline_ptr *)CONCAT17(uVar1,in_stack_fffffffffffffa98));
    local_8 = LEARNER::make_base<baseline,example>((learner<baseline,_example> *)pvVar4);
    local_480 = 1;
    std::__cxx11::string::~string(local_4a0);
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffa80);
  std::__cxx11::string::~string(local_50);
  std::unique_ptr<baseline,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<baseline,_void_(*)(void_*)> *)in_stack_fffffffffffffa90);
  return local_8;
}

Assistant:

base_learner* baseline_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<baseline>();
  bool baseline_option = false;
  std::string loss_function;

  option_group_definition new_options("Baseline options");
  new_options
      .add(make_option("baseline", baseline_option)
               .keep()
               .help("Learn an additive baseline (from constant features) and a residual separately in regression."))
      .add(make_option("lr_multiplier", data->lr_multiplier).help("learning rate multiplier for baseline model"))
      .add(make_option("global_only", data->global_only)
               .keep()
               .help("use separate example with only global constant for baseline predictions"))
      .add(make_option("check_enabled", data->check_enabled)
               .keep()
               .help("only use baseline when the example contains enabled flag"));
  options.add_and_parse(new_options);

  if (!baseline_option)
    return nullptr;

  // initialize baseline example
  data->ec = VW::alloc_examples(simple_label.label_size, 1);
  data->ec->in_use = true;
  data->all = &all;

  auto loss_function_type = all.loss->getType();
  if (loss_function_type != "logistic")
    data->lr_scaling = true;

  auto base = as_singleline(setup_base(options, all));

  learner<baseline, example>& l = init_learner(data, base, predict_or_learn<true>, predict_or_learn<false>);

  l.set_sensitivity(sensitivity);
  l.set_finish(finish);

  return make_base(l);
}